

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QPolygonF * __thiscall
QGraphicsView::mapToScene(QPolygonF *__return_storage_ptr__,QGraphicsView *this,QRect *rect)

{
  long lVar1;
  QGraphicsViewPrivate *this_00;
  qreal qVar2;
  double dVar3;
  qint64 qVar4;
  qint64 qVar5;
  pointer pQVar6;
  long lVar7;
  qreal *pqVar8;
  QPointF *pQVar9;
  long in_FS_OFFSET;
  byte bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  qreal qVar14;
  qreal qVar15;
  double dVar16;
  QRect QVar17;
  QTransform x;
  
  bVar10 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((rect->x2).m_i < (rect->x1).m_i) || ((rect->y2).m_i < (rect->y1).m_i)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_005ba715;
    (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)0x0;
    (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)0x0;
    (__return_storage_ptr__->super_QList<QPointF>).d.size = 0;
  }
  else {
    this_00 = *(QGraphicsViewPrivate **)(this + 8);
    qVar4 = QGraphicsViewPrivate::horizontalScroll(this_00);
    qVar5 = QGraphicsViewPrivate::verticalScroll(this_00);
    QVar17 = QRect::adjusted(rect,0,0,1,1);
    dVar3 = (double)QVar17.x1.m_i.m_i + (double)qVar4;
    dVar11 = (double)QVar17.y1.m_i.m_i + (double)qVar5;
    dVar16 = (double)QVar17.x2.m_i.m_i + (double)qVar4;
    dVar12 = (double)QVar17.y2.m_i.m_i + (double)qVar5;
    (__return_storage_ptr__->super_QList<QPointF>).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
    dVar13 = dVar12;
    QList<QPointF>::QList(&__return_storage_ptr__->super_QList<QPointF>,4);
    if ((this_00->field_0x300 & 0x10) == 0) {
      pqVar8 = (qreal *)&DAT_0067b698;
      pQVar9 = (QPointF *)&x;
      for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
        pQVar9->xp = *pqVar8;
        pqVar8 = pqVar8 + (ulong)bVar10 * -2 + 1;
        pQVar9 = (QPointF *)&pQVar9[-(ulong)bVar10].yp;
      }
      QTransform::inverted((bool *)&x);
      qVar2 = (qreal)QTransform::map((QPointF *)&x);
      qVar14 = dVar13;
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6->xp = qVar2;
      pQVar6->yp = dVar13;
      qVar2 = (qreal)QTransform::map((QPointF *)&x);
      qVar15 = qVar14;
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[1].xp = qVar2;
      pQVar6[1].yp = qVar14;
      qVar2 = (qreal)QTransform::map((QPointF *)&x);
      qVar14 = qVar15;
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[2].xp = qVar2;
      pQVar6[2].yp = qVar15;
      qVar2 = (qreal)QTransform::map((QPointF *)&x);
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[3].xp = qVar2;
      pQVar6[3].yp = qVar14;
    }
    else {
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6->xp = dVar3;
      pQVar6->yp = dVar11;
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[1].xp = dVar16;
      pQVar6[1].yp = dVar11;
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[2].xp = dVar16;
      pQVar6[2].yp = dVar12;
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[3].xp = dVar3;
      pQVar6[3].yp = dVar12;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_005ba715:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QPolygonF QGraphicsView::mapToScene(const QRect &rect) const
{
    Q_D(const QGraphicsView);
    if (!rect.isValid())
        return QPolygonF();

    QPointF scrollOffset(d->horizontalScroll(), d->verticalScroll());
    QRect r = rect.adjusted(0, 0, 1, 1);
    QPointF tl = scrollOffset + r.topLeft();
    QPointF tr = scrollOffset + r.topRight();
    QPointF br = scrollOffset + r.bottomRight();
    QPointF bl = scrollOffset + r.bottomLeft();

    QPolygonF poly(4);
    if (!d->identityMatrix) {
        QTransform x = d->matrix.inverted();
        poly[0] = x.map(tl);
        poly[1] = x.map(tr);
        poly[2] = x.map(br);
        poly[3] = x.map(bl);
    } else {
        poly[0] = tl;
        poly[1] = tr;
        poly[2] = br;
        poly[3] = bl;
    }
    return poly;
}